

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

IdentifierRole __thiscall
psy::C::Parser::guessRoleOfIdentifier(Parser *this,DeclarationContext declCtx)

{
  SyntaxKind SVar1;
  SyntaxToken *pSVar2;
  uint uVar3;
  uint uVar5;
  int iVar6;
  bool bVar7;
  ulong uVar4;
  
  pSVar2 = peek(this,2);
  bVar7 = true;
  switch(pSVar2->syntaxK_) {
  case IdentifierToken:
  case Keyword_auto:
  case KeywordAlias___const:
  case Keyword_extern:
  case KeywordAlias___inline:
  case Keyword_register:
  case KeywordAlias___restrict:
  case Keyword_static:
  case Keyword_typedef:
  case ENDof_KeywordOrPunctuatorToken:
  case AsteriskToken:
    goto switchD_002b5cc6_caseD_6;
  case IntegerConstantToken:
  case FloatingConstantToken:
  case ImaginaryIntegerConstantToken:
  case ImaginaryFloatingConstantToken:
  case CharacterConstantToken:
  case CharacterConstant_L_Token:
  case CharacterConstant_u_Token:
  case CharacterConstant_U_Token:
  case StringLiteralToken:
  case StringLiteral_L_Token:
  case StringLiteral_u8_Token:
  case StringLiteral_u_Token:
  case ENDof_ValuedToken:
  case EllipsisToken:
  case OpenBraceToken:
  case CloseBraceToken:
  case HashToken:
  case HashHashToken:
  case SemicolonToken:
  case Keyword_break:
  case Keyword_case:
  case Keyword_char:
  case Keyword_continue:
  case Keyword_default:
  case Keyword_do:
  case Keyword_double:
  case Keyword_else:
  case Keyword_enum:
  case Keyword_float:
  case Keyword_for:
  case Keyword_goto:
  case Keyword_if:
  case Keyword_int:
  case Keyword_long:
  case Keyword_return:
  case Keyword_short:
  case KeywordAlias___signed:
  case Keyword_struct:
  case Keyword_switch:
  case Keyword_union:
  case Keyword_unsigned:
  case Keyword_void:
  case Keyword_while:
  case ArrowToken:
  case DotToken:
  case PlusPlusToken:
  case MinusMinusToken:
    return Declarator;
  case OpenBracketToken:
    if (declCtx == Parameter) {
      return TypedefName;
    }
    uVar5 = 0;
    iVar6 = 1;
    uVar3 = 2;
LAB_002b5dae:
    do {
      while( true ) {
        do {
          uVar3 = uVar3 + 1;
          pSVar2 = peek(this,uVar3);
          SVar1 = pSVar2->syntaxK_;
        } while (SVar1 == AsteriskToken);
        if (CloseBraceToken < SVar1) break;
        if (SVar1 == EndOfFile) {
          return Declarator;
        }
        if (SVar1 == IdentifierToken) {
          uVar5 = -(uint)(uVar5 == 0) | 1;
        }
        else {
LAB_002b5e07:
          uVar5 = uVar5 + 1;
        }
      }
      if (SVar1 == SemicolonToken) {
        return Declarator;
      }
      if (SVar1 != CloseBracketToken) {
        if (SVar1 != OpenBracketToken) goto LAB_002b5e07;
        iVar6 = iVar6 + 1;
        goto LAB_002b5dae;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  case CloseBracketToken:
  case CloseParenToken:
    pSVar2 = peek(this,3);
    if (pSVar2->syntaxK_ != OpenBraceToken) {
      return this->isWithinKandRFuncDef_ ^ TypedefName;
    }
    return Declarator;
  case OpenParenToken:
    if (declCtx == Parameter) {
      return TypedefName;
    }
    uVar5 = 0;
    iVar6 = 1;
    uVar3 = 2;
LAB_002b5d40:
    do {
      while( true ) {
        do {
          uVar3 = uVar3 + 1;
          pSVar2 = peek(this,uVar3);
          SVar1 = pSVar2->syntaxK_;
        } while (SVar1 == AsteriskToken);
        if (CloseBracketToken < SVar1) break;
        if (SVar1 == EndOfFile) {
          return Declarator;
        }
        if (SVar1 == IdentifierToken) {
          uVar5 = -(uint)(uVar5 == 0) | 1;
        }
        else {
LAB_002b5d91:
          uVar5 = uVar5 + 1;
        }
      }
      if (SVar1 == SemicolonToken) {
        return Declarator;
      }
      if (SVar1 != CloseParenToken) {
        if (SVar1 != OpenParenToken) goto LAB_002b5d91;
        iVar6 = iVar6 + 1;
        goto LAB_002b5d40;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  default:
    uVar3 = pSVar2->syntaxK_ - 100;
    uVar4 = (ulong)uVar3;
    if (0x23 < uVar3) {
      return Declarator;
    }
    if ((0x3001540UL >> (uVar4 & 0x3f) & 1) != 0) {
      return TypedefName;
    }
    if ((0x80000601cU >> (uVar4 & 0x3f) & 1) != 0) {
      return Declarator;
    }
    if (uVar4 != 0) {
      return Declarator;
    }
    return this->isWithinKandRFuncDef_ ^ TypedefName;
  }
  bVar7 = uVar5 == 0xffffffff;
switchD_002b5cc6_caseD_6:
  return bVar7;
}

Assistant:

Parser::IdentifierRole Parser::guessRoleOfIdentifier(DeclarationContext declCtx) const
{
    auto LA = 2;
    while (true) {
        switch (peek(LA).kind()) {
            case SyntaxKind::IdentifierToken:
                return IdentifierRole::TypedefName;

            // type-specifier
            case SyntaxKind::Keyword_void:
            case SyntaxKind::Keyword_char:
            case SyntaxKind::Keyword_short:
            case SyntaxKind::Keyword_int:
            case SyntaxKind::Keyword_long:
            case SyntaxKind::Keyword_float:
            case SyntaxKind::Keyword_double:
            case SyntaxKind::Keyword__Bool:
            case SyntaxKind::Keyword__Complex:
            case SyntaxKind::Keyword_signed:
            case SyntaxKind::Keyword_unsigned:
            case SyntaxKind::Keyword_Ext_char16_t:
            case SyntaxKind::Keyword_Ext_char32_t:
            case SyntaxKind::Keyword_Ext_wchar_t:
            case SyntaxKind::Keyword_struct:
            case SyntaxKind::Keyword_union:
            case SyntaxKind::Keyword_enum:
            case SyntaxKind::Keyword_ExtGNU___complex__:
                return IdentifierRole::Declarator;

            // storage-class-specifier
            case SyntaxKind::Keyword_typedef:
            case SyntaxKind::Keyword_extern:
            case SyntaxKind::Keyword_static:
            case SyntaxKind::Keyword_auto:
            case SyntaxKind::Keyword_register:
            case SyntaxKind::Keyword__Thread_local:
            case SyntaxKind::Keyword_ExtGNU___thread:
                return IdentifierRole::TypedefName;

            // type-qualifier
            case SyntaxKind::Keyword_const:
            case SyntaxKind::Keyword_volatile:
            case SyntaxKind::Keyword_restrict:
            case SyntaxKind::Keyword__Atomic:
                return IdentifierRole::TypedefName;

            // function-specifier
            case SyntaxKind::Keyword_inline:
            case SyntaxKind::Keyword__Noreturn:
                return IdentifierRole::TypedefName;

            // alignment-specifier
            case SyntaxKind::Keyword__Alignas:
                return IdentifierRole::TypedefName;

            // attribute-specifier
            case SyntaxKind::Keyword_ExtGNU___attribute__:
                return IdentifierRole::TypedefName;

            // pointer-declarator
            case SyntaxKind::AsteriskToken:
                return IdentifierRole::TypedefName;

            case SyntaxKind::OpenParenToken: {
                if (declCtx == DeclarationContext::Parameter)
                    return IdentifierRole::TypedefName;
                auto parens = 1;
                auto check = 0;
                while (true) {
                    switch (peek(LA + 1).kind()) {
                        case SyntaxKind::OpenParenToken:
                            ++parens;
                            ++LA;
                            continue;
                        case SyntaxKind::CloseParenToken:
                            --parens;
                            if (!parens)
                                break;
                            ++LA;
                            continue;
                        case SyntaxKind::IdentifierToken:
                            if (check == 0)
                                check = -1;
                            else
                                check = 1;
                            ++LA;
                            continue;
                        case SyntaxKind::AsteriskToken:
                            ++LA;
                            continue;
                        case SyntaxKind::SemicolonToken:
                        case SyntaxKind::EndOfFile:
                            return IdentifierRole::Declarator;
                        default:
                            ++check;
                            ++LA;
                            continue;
                    }
                    break;
                }
                return check == -1
                        ? IdentifierRole::TypedefName
                        : IdentifierRole::Declarator;
            }

            case SyntaxKind::CloseParenToken:
                return peek(LA + 1).kind() == SyntaxKind::OpenBraceToken
                        ? IdentifierRole::Declarator
                        : isWithinKandRFuncDef_
                            ? IdentifierRole::Declarator
                            : IdentifierRole::TypedefName;

            case SyntaxKind::OpenBracketToken: {
                if (declCtx == DeclarationContext::Parameter)
                    return IdentifierRole::TypedefName;
                auto brackets = 1;
                auto check = 0;
                while (true) {
                    switch (peek(LA + 1).kind()) {
                        case SyntaxKind::OpenBracketToken:
                            ++brackets;
                            ++LA;
                            continue;
                        case SyntaxKind::CloseBracketToken:
                            --brackets;
                            if (!brackets)
                                break;
                            ++LA;
                            continue;
                        case SyntaxKind::IdentifierToken:
                            if (check == 0)
                                check = -1;
                            else
                                check = 1;
                            ++LA;
                            continue;
                        case SyntaxKind::AsteriskToken:
                            ++LA;
                            continue;
                        case SyntaxKind::SemicolonToken:
                        case SyntaxKind::EndOfFile:
                            return IdentifierRole::Declarator;
                        default:
                            ++check;
                            ++LA;
                            continue;
                    }
                    break;
                }
                return check == -1
                        ? IdentifierRole::TypedefName
                        : IdentifierRole::Declarator;
            }

            case SyntaxKind::CloseBracketToken:
                return peek(LA + 1).kind() == SyntaxKind::OpenBraceToken
                        ? IdentifierRole::Declarator
                        : isWithinKandRFuncDef_
                            ? IdentifierRole::Declarator
                            : IdentifierRole::TypedefName;

            case SyntaxKind::CommaToken:
                return isWithinKandRFuncDef_
                        ? IdentifierRole::Declarator
                        : IdentifierRole::TypedefName;

            default:
                return IdentifierRole::Declarator;
        }
    }
}